

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_cache_operation(DisasContext_conflict6 *ctx,uint32_t op,int base,int16_t offset)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i32 pTVar1;
  TCGTemp *pTVar2;
  undefined6 in_register_0000000a;
  uintptr_t o;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGv_i32 local_38;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  pTVar1 = tcg_const_i32_mips64el(tcg_ctx,op);
  pTVar2 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
  gen_base_offset_addr
            (ctx,(TCGv_i64)((long)pTVar2 - (long)tcg_ctx),base,
             (int)CONCAT62(in_register_0000000a,offset));
  local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_38 = pTVar1 + (long)tcg_ctx;
  local_40 = pTVar2;
  tcg_gen_callN_mips64el(tcg_ctx,helper_cache_mips64el,(TCGTemp *)0x0,3,&local_48);
  return;
}

Assistant:

static void gen_cache_operation(DisasContext *ctx, uint32_t op, int base,
                                int16_t offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_const_i32(tcg_ctx, op);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    gen_base_offset_addr(ctx, t1, base, offset);
    gen_helper_cache(tcg_ctx, tcg_ctx->cpu_env, t1, t0);
}